

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDTestBaseUncomp<3U,_2U>::customize
          (createDFDTestBaseUncomp<3U,_2U> *this,ktx_uint8_t model,ktx_uint8_t primaries,
          ktx_uint8_t transfer,ktx_uint8_t flags,
          initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_2U>::sampleType> samples)

{
  undefined8 uVar1;
  const_iterator psVar2;
  undefined8 *puVar3;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  undefined4 in_R8D;
  sampleType sample;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_2U>::sampleType> *__range2;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffb0;
  const_iterator local_20;
  uint local_10;
  
  *(ulong *)(in_RDI + 0x18) = *(ulong *)(in_RDI + 0x18) & 0xffffffffffffff00 | (ulong)in_SIL;
  *(ulong *)(in_RDI + 0x18) = *(ulong *)(in_RDI + 0x18) & 0xffffffffffff00ff | (ulong)in_DL << 8;
  *(ulong *)(in_RDI + 0x18) = *(ulong *)(in_RDI + 0x18) & 0xffffffffff00ffff | (ulong)in_CL << 0x10;
  *(ulong *)(in_RDI + 0x18) =
       *(ulong *)(in_RDI + 0x18) & 0xffffffff00ffffff | (ulong)(byte)in_R8D << 0x18;
  local_10 = 0;
  local_20 = std::initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_2U>::sampleType>::
             begin((initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_2U>::sampleType> *
                   )&stack0x00000008);
  psVar2 = std::initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_2U>::sampleType>::end
                     ((initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_2U>::sampleType>
                       *)CONCAT44(in_R8D,in_stack_ffffffffffffffb0));
  while( true ) {
    if (local_20 == psVar2) {
      return;
    }
    uVar1 = *(undefined8 *)&local_20->lower;
    puVar3 = (undefined8 *)(in_RDI + 0x28 + (ulong)local_10 * 0x10);
    *puVar3 = *(undefined8 *)local_20;
    puVar3[1] = uVar1;
    local_10 = local_10 + 1;
    if (local_10 == 3) break;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void customize(ktx_uint8_t model,
                   ktx_uint8_t primaries, ktx_uint8_t transfer,
                   ktx_uint8_t flags,
                   std::initializer_list<sampleType> samples) {
        expected.model = model;
        expected.primaries = primaries;
        expected.transfer = transfer;
        expected.flags = flags;

        uint32_t i = 0; // There's got to be some syntax for declaring this in the for
        for (auto sample : samples ) {
            expected.samples[i] = sample;
            if (++i == numComponents)
                break;
        }
    }